

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_custom_reset(flatcc_builder_t *B,int set_defaults,int reduce_buffers)

{
  int iVar1;
  flatcc_iovec_t *pfVar2;
  int local_2c;
  int i;
  flatcc_iovec_t *buf;
  int reduce_buffers_local;
  int set_defaults_local;
  flatcc_builder_t *B_local;
  
  local_2c = 0;
  do {
    if (7 < local_2c) {
      B->vb_end = 0;
      if (B->vd_end != 0) {
        B->vd_end = 0x10;
      }
      B->min_align = 0;
      B->emit_start = 0;
      B->emit_end = 0;
      B->level = 0;
      B->limit_level = 0;
      B->ds_offset = 0;
      B->ds_limit = 0;
      B->nest_count = 0;
      B->nest_id = 0;
      B->ds = (uint8_t *)B->buffers[1].iov_base;
      B->pl = (flatbuffers_voffset_t *)B->buffers[3].iov_base;
      B->vs = (flatbuffers_voffset_t *)B->buffers[0].iov_base;
      B->frame = (__flatcc_builder_frame_t *)0x0;
      if (set_defaults != 0) {
        B->vb_flush_limit = 0;
        B->max_level = 0;
        B->disable_vt_clustering = 0;
      }
      if (B->is_default_emitter != 0) {
        flatcc_emitter_reset(&B->default_emit_context);
      }
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        flatcc_refmap_reset(B->refmap);
      }
      return 0;
    }
    pfVar2 = B->buffers + local_2c;
    if (pfVar2->iov_base == (void *)0x0) {
      if (pfVar2->iov_len != 0) {
        __assert_fail("buf->iov_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x1ba,"int flatcc_builder_custom_reset(flatcc_builder_t *, int, int)");
      }
    }
    else {
      if (((local_2c != 5) && (reduce_buffers != 0)) &&
         (iVar1 = (*B->alloc)(B->alloc_context,pfVar2,1,1,local_2c), iVar1 != 0)) {
        return -1;
      }
      memset(pfVar2->iov_base,0,pfVar2->iov_len);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int flatcc_builder_custom_reset(flatcc_builder_t *B, int set_defaults, int reduce_buffers)
{
    iovec_t *buf;
    int i;

    for (i = 0; i < FLATCC_BUILDER_ALLOC_BUFFER_COUNT; ++i) {
        buf = B->buffers + i;
        if (buf->iov_base) {
            /* Don't try to reduce the hash table. */
            if (i != flatcc_builder_alloc_ht &&
                reduce_buffers && B->alloc(B->alloc_context, buf, 1, 1, i)) {
                return -1;
            }
            memset(buf->iov_base, 0, buf->iov_len);
        } else {
            FLATCC_ASSERT(buf->iov_len == 0);
        }
    }
    B->vb_end = 0;
    if (B->vd_end > 0) {
        /* Reset past null entry. */
        B->vd_end = sizeof(vtable_descriptor_t);
    }
    B->min_align = 0;
    B->emit_start = 0;
    B->emit_end = 0;
    B->level = 0;
    B->limit_level = 0;
    B->ds_offset = 0;
    B->ds_limit = 0;
    B->nest_count = 0;
    B->nest_id = 0;
    /* Needed for correct offset calculation. */
    B->ds = B->buffers[flatcc_builder_alloc_ds].iov_base;
    B->pl = B->buffers[flatcc_builder_alloc_pl].iov_base;
    B->vs = B->buffers[flatcc_builder_alloc_vs].iov_base;
    B->frame = 0;
    if (set_defaults) {
        B->vb_flush_limit = 0;
        B->max_level = 0;
        B->disable_vt_clustering = 0;
    }
    if (B->is_default_emitter) {
        flatcc_emitter_reset(&B->default_emit_context);
    }
    if (B->refmap) {
        flatcc_refmap_reset(B->refmap);
    }
    return 0;
}